

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

Dimensions ftxui::Dimension::Fit(Element *e)

{
  uint uVar1;
  uint uVar2;
  element_type *peVar3;
  Dimensions DVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  Status status;
  int local_40;
  byte local_3c;
  ulong local_38;
  
  DVar4 = Full();
  local_38 = (ulong)DVar4 >> 0x20;
  local_40 = 0;
  uVar5 = (ulong)DVar4 & 0xffffffff00000000;
  local_3c = 0;
  peVar3 = (e->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar3->_vptr_Node[5])(peVar3,&local_40);
  uVar6 = (ulong)DVar4 & 0xffffffff;
  while (((local_3c & 1) != 0 && (local_40 < 0x14))) {
    (*((e->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Node[2])();
    peVar3 = (e->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    uVar1 = (peVar3->requirement_).min_x;
    if ((int)uVar1 < (int)uVar6) {
      uVar6 = (ulong)uVar1;
    }
    uVar1 = (peVar3->requirement_).min_y;
    uVar7 = uVar5 >> 0x20;
    if ((int)uVar1 < (int)(uVar5 >> 0x20)) {
      uVar7 = (ulong)uVar1;
    }
    uVar5 = uVar7 << 0x20;
    (*peVar3->_vptr_Node[3])(peVar3,uVar6 << 0x20,uVar5);
    local_3c = 0;
    local_40 = local_40 + 1;
    peVar3 = (e->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar3->_vptr_Node[5])(peVar3,&local_40);
    if (local_3c != 1) break;
    peVar3 = (e->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    uVar1 = (peVar3->requirement_).min_x;
    uVar2 = (peVar3->requirement_).min_y;
    uVar6 = (ulong)uVar1;
    if (DVar4.dimx <= (int)uVar1) {
      uVar6 = (ulong)DVar4 & 0xffffffff;
    }
    uVar5 = (ulong)uVar2;
    if ((int)local_38 <= (int)uVar2) {
      uVar5 = local_38 & 0xffffffff;
    }
    uVar5 = uVar5 << 0x20;
  }
  return (Dimensions)(uVar6 | uVar5);
}

Assistant:

Dimensions Dimension::Fit(Element& e) {
  const Dimensions fullsize = Dimension::Full();
  Box box;
  box.x_min = 0;
  box.y_min = 0;
  box.x_max = fullsize.dimx;
  box.y_max = fullsize.dimy;

  Node::Status status;
  e->Check(&status);
  const int max_iteration = 20;
  while (status.need_iteration && status.iteration < max_iteration) {
    e->ComputeRequirement();

    // Don't give the element more space than it needs:
    box.x_max = std::min(box.x_max, e->requirement().min_x);
    box.y_max = std::min(box.y_max, e->requirement().min_y);

    e->SetBox(box);
    status.need_iteration = false;
    status.iteration++;
    e->Check(&status);

    if (!status.need_iteration) {
      break;
    }
    // Increase the size of the box until it fits, but not more than the with of
    // the terminal emulator:
    box.x_max = std::min(e->requirement().min_x, fullsize.dimx);
    box.y_max = std::min(e->requirement().min_y, fullsize.dimy);
  }

  return {
      box.x_max,
      box.y_max,
  };
}